

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

cbtScalar __thiscall
cbtCollisionWorld::objectQuerySingleInternal::BridgeTriangleConvexcastCallback::reportHit
          (BridgeTriangleConvexcastCallback *this,cbtVector3 *hitNormalLocal,
          cbtVector3 *hitPointLocal,cbtScalar hitFraction,int partId,int triangleIndex)

{
  ConvexResultCallback *pCVar1;
  cbtScalar extraout_XMM0_Da;
  LocalShapeInfo shapeInfo;
  LocalConvexResult convexResult;
  int local_40;
  int local_3c;
  cbtCollisionObject *local_38;
  int *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  cbtScalar local_8;
  
  pCVar1 = this->m_resultCallback;
  if (hitFraction <= pCVar1->m_closestHitFraction) {
    local_38 = this->m_collisionObject;
    local_30 = &local_40;
    local_28 = *(undefined8 *)hitNormalLocal->m_floats;
    uStack_20 = *(undefined8 *)(hitNormalLocal->m_floats + 2);
    local_18 = *(undefined8 *)hitPointLocal->m_floats;
    uStack_10 = *(undefined8 *)(hitPointLocal->m_floats + 2);
    local_40 = partId;
    local_3c = triangleIndex;
    local_8 = hitFraction;
    (*pCVar1->_vptr_ConvexResultCallback[3])(pCVar1,&local_38,1);
    hitFraction = extraout_XMM0_Da;
  }
  return hitFraction;
}

Assistant:

virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{
							cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																			 &shapeInfo,
																			 hitNormalLocal,
																			 hitPointLocal,
																			 hitFraction);

							bool normalInWorldSpace = true;

							return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
						}
						return hitFraction;
					}